

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ManCounterExampleValueStart(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  ulong uVar9;
  uint uVar10;
  void *pvVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  bool bVar22;
  
  uVar17 = pAig->nRegs;
  if ((int)uVar17 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x532,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  if (pAig->pData2 != (void *)0x0) {
    __assert_fail("pAig->pData2 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x533,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  pVVar5 = pAig->vObjs;
  iVar2 = pVVar5->nSize;
  uVar10 = (pCex->iFrame + 1) * iVar2;
  pvVar11 = calloc((long)(int)((((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0)),4);
  pAig->pData2 = pvVar11;
  uVar10 = 0;
  do {
    if ((pAig->nTruePis < 0) || (pAig->vCis->nSize <= (int)(pAig->nTruePis + uVar10)))
    goto LAB_006d56f5;
    if (((uint)(&pCex[1].iPo)[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
      __assert_fail("Abc_InfoHasBit(pCex->pData, iBit++) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x538,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    uVar10 = uVar10 + 1;
  } while (uVar17 != uVar10);
  iVar3 = pCex->iFrame;
  uVar10 = uVar17;
  if (-1 < iVar3) {
    uVar4 = pAig->nTruePis;
    iVar20 = 0;
    uVar12 = 0;
    if (0 < (int)uVar4) {
      uVar12 = uVar4;
    }
    do {
      iVar16 = iVar20 * iVar2;
      puVar1 = (uint *)((long)pvVar11 + (long)(iVar16 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)iVar16 & 0x1f);
      uVar10 = uVar17;
      if (0 < (int)uVar4) {
        pVVar6 = pAig->vCis;
        uVar10 = uVar4 + uVar17;
        uVar18 = 0;
        do {
          if ((long)pVVar6->nSize <= (long)uVar18) goto LAB_006d56f5;
          uVar13 = uVar17 + (int)uVar18;
          if (((uint)(&pCex[1].iPo)[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) {
            iVar14 = *(int *)((long)pVVar6->pArray[uVar18] + 0x24) + iVar16;
            puVar1 = (uint *)((long)pvVar11 + (long)(iVar14 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar14 & 0x1f);
          }
          uVar18 = uVar18 + 1;
        } while (uVar4 != uVar18);
      }
      if (0 < pVVar5->nSize) {
        ppvVar7 = pVVar5->pArray;
        lVar19 = 0;
        do {
          pvVar8 = ppvVar7[lVar19];
          if ((pvVar8 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar8 + 0x18) & 7) - 7)) {
            uVar18 = *(ulong *)((long)pvVar8 + 8);
            iVar15 = -1;
            iVar14 = -1;
            if (uVar18 != 0) {
              iVar14 = *(int *)((uVar18 & 0xfffffffffffffffe) + 0x24);
            }
            uVar9 = *(ulong *)((long)pvVar8 + 0x10);
            if (uVar9 != 0) {
              iVar15 = *(int *)((uVar9 & 0xfffffffffffffffe) + 0x24);
            }
            if ((((uint)uVar9 ^
                 *(uint *)((long)pvVar11 + (long)(iVar15 + iVar16 >> 5) * 4) >>
                 ((byte)(iVar15 + iVar16) & 0x1f)) &
                 (*(uint *)((long)pvVar11 + (long)(iVar14 + iVar16 >> 5) * 4) >>
                  ((byte)(iVar14 + iVar16) & 0x1f) ^ (uint)uVar18) & 1) != 0) {
              iVar14 = *(int *)((long)pvVar8 + 0x24) + iVar16;
              puVar1 = (uint *)((long)pvVar11 + (long)(iVar14 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)iVar14 & 0x1f);
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < pVVar5->nSize);
      }
      pVVar6 = pAig->vCos;
      if (0 < pVVar6->nSize) {
        ppvVar7 = pVVar6->pArray;
        lVar19 = 0;
        do {
          uVar18 = *(ulong *)((long)ppvVar7[lVar19] + 8);
          if (uVar18 == 0) {
            iVar14 = -1;
          }
          else {
            iVar14 = *(int *)((uVar18 & 0xfffffffffffffffe) + 0x24);
          }
          if ((((uint)uVar18 ^
               *(uint *)((long)pvVar11 + (long)(iVar14 + iVar16 >> 5) * 4) >>
               ((byte)(iVar14 + iVar16) & 0x1f)) & 1) != 0) {
            iVar14 = *(int *)((long)ppvVar7[lVar19] + 0x24) + iVar16;
            puVar1 = (uint *)((long)pvVar11 + (long)(iVar14 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar14 & 0x1f);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < pVVar6->nSize);
      }
      if ((iVar20 != iVar3) && (iVar14 = pAig->nRegs, 0 < (long)iVar14)) {
        uVar13 = pAig->nTruePos;
        lVar19 = 0;
        do {
          if (((int)uVar13 < 0) || (pVVar6->nSize <= (int)((int)lVar19 + uVar13)))
          goto LAB_006d56f5;
          uVar18 = (ulong)(uint)pAig->nTruePis + lVar19;
          iVar15 = (int)uVar18;
          if ((iVar15 < 0) || (pAig->vCis->nSize <= iVar15)) goto LAB_006d56f5;
          uVar21 = *(int *)((long)pVVar6->pArray[(ulong)uVar13 + lVar19] + 0x24) + iVar16;
          if ((*(uint *)((long)pvVar11 + (long)((int)uVar21 >> 5) * 4) >> (uVar21 & 0x1f) & 1) != 0)
          {
            iVar15 = *(int *)((long)pAig->vCis->pArray[uVar18 & 0xffffffff] + 0x24) +
                     (iVar20 + 1) * iVar2;
            puVar1 = (uint *)((long)pvVar11 + (long)(iVar15 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)iVar15 & 0x1f);
          }
          lVar19 = lVar19 + 1;
        } while (iVar14 != lVar19);
      }
      uVar17 = uVar17 + uVar12;
      bVar22 = iVar20 != iVar3;
      iVar20 = iVar20 + 1;
    } while (bVar22);
  }
  if (uVar10 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x559,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar20 = pCex->iPo;
  if ((-1 < (long)iVar20) && (iVar20 < pAig->vCos->nSize)) {
    uVar17 = iVar3 * iVar2 + *(int *)((long)pAig->vCos->pArray[iVar20] + 0x24);
    if ((*(uint *)((long)pvVar11 + (long)((int)uVar17 >> 5) * 4) >> (uVar17 & 0x1f) & 1) == 0) {
      __assert_fail("Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) )"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                    ,0x55b,"void Aig_ManCounterExampleValueStart(Aig_Man_t *, Abc_Cex_t *)");
    }
    return;
  }
LAB_006d56f5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Aig_ManCounterExampleValueStart( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int Val0, Val1, nObjs, i, k, iBit = 0;
    assert( Aig_ManRegNum(pAig) > 0 ); // makes sense only for sequential AIGs
    assert( pAig->pData2 == NULL );    // if this fail, there may be a memory leak
    // allocate memory to store simulation bits for internal nodes
    pAig->pData2 = ABC_CALLOC( unsigned, Abc_BitWordNum( (pCex->iFrame + 1) * Aig_ManObjNumMax(pAig) ) );
    // the register values in the counter-example should be zero
    Saig_ManForEachLo( pAig, pObj, k )
        assert( Abc_InfoHasBit(pCex->pData, iBit++) == 0 );
    // iterate through the timeframes
    nObjs = Aig_ManObjNumMax(pAig);
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        // set constant 1 node
        Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + 0 );
        // set primary inputs according to the counter-example
        Saig_ManForEachPi( pAig, pObj, k )
            if ( Abc_InfoHasBit(pCex->pData, iBit++) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        // compute values for each node
        Aig_ManForEachNode( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            Val1 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId1(pObj) );
            if ( (Val0 ^ Aig_ObjFaninC0(pObj)) & (Val1 ^ Aig_ObjFaninC1(pObj)) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        // derive values for combinational outputs
        Aig_ManForEachCo( pAig, pObj, k )
        {
            Val0 = Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjFaninId0(pObj) );
            if ( Val0 ^ Aig_ObjFaninC0(pObj) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObj) );
        }
        if ( i == pCex->iFrame )
            continue;
        // transfer values to the register output of the next frame
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            if ( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * i + Aig_ObjId(pObjRi) ) )
                Abc_InfoSetBit( (unsigned *)pAig->pData2, nObjs * (i+1) + Aig_ObjId(pObjRo) );
    }
    assert( iBit == pCex->nBits );
    // check that the counter-example is correct, that is, the corresponding output is asserted
    assert( Abc_InfoHasBit( (unsigned *)pAig->pData2, nObjs * pCex->iFrame + Aig_ObjId(Aig_ManCo(pAig, pCex->iPo)) ) );
}